

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O2

void __thiscall flatfile_tests::flatfile_allocate::test_method(flatfile_allocate *this)

{
  long lVar1;
  path dir;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  undefined ***pppuVar3;
  FlatFilePos *pFVar4;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  check_type cVar6;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  _List in_stack_fffffffffffffd38;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  FlatFilePos local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  undefined4 local_17c;
  FlatFilePos local_178;
  char *local_170;
  char *local_168;
  assertion_result local_160;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  bool out_of_space;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  undefined8 local_d0;
  path local_c0;
  FlatFileSeq seq;
  path data_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&data_dir.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir.super_path);
  dir.super_path._M_pathname._M_string_length = in_stack_fffffffffffffd20;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd18;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffd28;
  dir.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffd30;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       in_stack_fffffffffffffd38._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq,dir,(char *)&local_c0,0xbaa2de);
  std::filesystem::__cxx11::path::~path(&local_c0);
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x63;
  file.m_begin = (iterator)&local_100;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_110,msg);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_118 = "";
  local_1b0.nFile = 0;
  local_1b0.nPos = 0;
  local_160._0_8_ = FlatFileSeq::Allocate(&seq,&local_1b0,1,&out_of_space);
  pppuVar3 = (undefined ***)&local_160;
  local_178.nFile = 100;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_e8,&local_120,99,1,2,pppuVar3,"seq.Allocate(FlatFilePos(0, 0), 1, out_of_space)",
             &local_178,"100U");
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x64;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = (iterator)pppuVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
  local_160._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_168 = "";
  local_178.nFile = 0;
  local_178.nPos = 0;
  FlatFileSeq::FileName((path *)local_e8,&seq,&local_178);
  local_1b0 = (FlatFilePos)std::filesystem::file_size((path *)local_e8);
  local_17c = 100;
  pvVar2 = (iterator)0x2;
  pFVar4 = &local_1b0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_160,&local_170,100,1,2,&local_1b0,
             "fs::file_size(seq.FileName(FlatFilePos(0, 0)))",&local_17c,"100U");
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x330e2e;
  file_01.m_end = (iterator)0x65;
  file_01.m_begin = (iterator)&local_190;
  msg_01.m_end = (iterator)pFVar4;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a0,
             msg_01);
  local_160._0_8_ = CONCAT71(local_160._1_7_,out_of_space) ^ 1;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = (FlatFilePos)0xba7da4;
  local_1a8 = "";
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1b8 = "";
  pvVar2 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_d0 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)local_e8,1,0,WARN,_cVar6,(size_t)&local_1c0,0x65);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x67;
  file_02.m_begin = (iterator)&local_1d0;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e0,
             msg_02);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1e8 = "";
  local_1b0.nFile = 0;
  local_1b0.nPos = 99;
  local_160._0_8_ = FlatFileSeq::Allocate(&seq,&local_1b0,1,&out_of_space);
  pppuVar3 = (undefined ***)&local_160;
  local_178 = (FlatFilePos)((ulong)local_178 & 0xffffffff00000000);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_e8,&local_1f0,0x67,1,2,pppuVar3,
             "seq.Allocate(FlatFilePos(0, 99), 1, out_of_space)",&local_178,"0U");
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = &DAT_00000068;
  file_03.m_begin = (iterator)&local_200;
  msg_03.m_end = (iterator)pppuVar3;
  msg_03.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_210,
             msg_03);
  local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
  local_160._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_218 = "";
  local_178.nFile = 0;
  local_178.nPos = 99;
  FlatFileSeq::FileName((path *)local_e8,&seq,&local_178);
  local_1b0 = (FlatFilePos)std::filesystem::file_size((path *)local_e8);
  local_17c = 100;
  pvVar2 = (iterator)0x2;
  pFVar4 = &local_1b0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_160,&local_220,0x68,1,2,&local_1b0,
             "fs::file_size(seq.FileName(FlatFilePos(0, 99)))",&local_17c,"100U");
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar6 = 0x3310d9;
  file_04.m_end = (iterator)0x69;
  file_04.m_begin = (iterator)&local_230;
  msg_04.m_end = (iterator)pFVar4;
  msg_04.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_240,
             msg_04);
  local_160._0_8_ = CONCAT71(local_160._1_7_,out_of_space) ^ 1;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = (FlatFilePos)0xba7da4;
  local_1a8 = "";
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_248 = "";
  pvVar2 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_d0 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)local_e8,1,0,WARN,_cVar6,(size_t)&local_250,0x69);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x6b;
  file_05.m_begin = (iterator)&local_260;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_270,
             msg_05);
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (long)"\x05\x04\x03\x02\x01" + 5;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_278 = "";
  local_1b0.nFile = 0;
  local_1b0.nPos = 99;
  local_160._0_8_ = FlatFileSeq::Allocate(&seq,&local_1b0,2,&out_of_space);
  pppuVar3 = (undefined ***)&local_160;
  local_178.nFile = 0x65;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_e8,&local_280,0x6b,1,2,pppuVar3,
             "seq.Allocate(FlatFilePos(0, 99), 2, out_of_space)",&local_178,"101U");
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x6c;
  file_06.m_begin = (iterator)&local_290;
  msg_06.m_end = (iterator)pppuVar3;
  msg_06.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2a0,
             msg_06);
  local_160.m_message.px = (element_type *)((ulong)local_160.m_message.px & 0xffffffffffffff00);
  local_160._0_8_ = &PTR__lazy_ostream_011480b0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_148 = "";
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2a8 = "";
  local_178.nFile = 0;
  local_178.nPos = 99;
  FlatFileSeq::FileName((path *)local_e8,&seq,&local_178);
  local_1b0 = (FlatFilePos)std::filesystem::file_size((path *)local_e8);
  local_17c = 200;
  pvVar2 = (iterator)0x2;
  pFVar4 = &local_1b0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&local_160,&local_2b0,0x6c,1,2,&local_1b0,
             "fs::file_size(seq.FileName(FlatFilePos(0, 99)))",&local_17c,"200U");
  std::filesystem::__cxx11::path::~path((path *)local_e8);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2b8 = "";
  _cVar6 = 0x331362;
  file_07.m_end = (iterator)0x6d;
  file_07.m_begin = (iterator)&local_2c0;
  msg_07.m_end = (iterator)pFVar4;
  msg_07.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
             (size_t)&stack0xfffffffffffffd30,msg_07);
  local_160._0_8_ = CONCAT71(local_160._1_7_,out_of_space) ^ 1;
  local_160.m_message.px = (element_type *)0x0;
  local_160.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = (FlatFilePos)0xba7da4;
  local_1a8 = "";
  local_e8[8] = false;
  local_e8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_d8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_1b0;
  boost::test_tools::tt_detail::report_assertion
            (&local_160,(lazy_ostream *)local_e8,1,0,WARN,_cVar6,(size_t)&stack0xfffffffffffffd20,
             0x6d);
  boost::detail::shared_count::~shared_count(&local_160.m_message.pn);
  std::filesystem::__cxx11::path::~path((path *)&seq);
  std::filesystem::__cxx11::path::~path(&data_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_allocate)
{
    const auto data_dir = m_args.GetDataDirBase();
    FlatFileSeq seq(data_dir, "a", 100);

    bool out_of_space;

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 0), 1, out_of_space), 100U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 0))), 100U);
    BOOST_CHECK(!out_of_space);

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 99), 1, out_of_space), 0U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 99))), 100U);
    BOOST_CHECK(!out_of_space);

    BOOST_CHECK_EQUAL(seq.Allocate(FlatFilePos(0, 99), 2, out_of_space), 101U);
    BOOST_CHECK_EQUAL(fs::file_size(seq.FileName(FlatFilePos(0, 99))), 200U);
    BOOST_CHECK(!out_of_space);
}